

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
SetAllPropertiesToUndefined
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this,
          DynamicObject *instance,bool invalidateFixedFields)

{
  ushort uVar1;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar2;
  ScriptContext *scriptContext;
  PropertyRecord *propertyKey;
  RecyclableObject *value;
  PropertyRecord **ppPVar3;
  SimpleDictionaryPropertyDescriptor<unsigned_short> *descriptor;
  undefined7 in_register_00000011;
  int index;
  int iVar4;
  uint index_00;
  
  DynamicTypeHandler::ChangeFlags(&this->super_DynamicTypeHandler,0xc1,'\x01');
  if (((int)CONCAT71(in_register_00000011,invalidateFixedFields) != 0) &&
     (pBVar2 = (this->propertyMap).ptr, iVar4 = pBVar2->count - pBVar2->freeCount, 0 < iVar4)) {
    scriptContext =
         (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
    index = 0;
    do {
      ppPVar3 = JsUtil::
                BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                ::GetKeyAt((this->propertyMap).ptr,index);
      propertyKey = *ppPVar3;
      descriptor = JsUtil::
                   BaseDictionary<const_Js::PropertyRecord_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<const_Js::PropertyRecord_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetReferenceAt((this->propertyMap).ptr,index);
      SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>::
      InvalidateFixedField<Js::PropertyRecord_const*>
                ((SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true> *)
                 this,propertyKey,descriptor,scriptContext);
      index = index + 1;
    } while (iVar4 != index);
  }
  uVar1 = this->nextPropertyIndex;
  if (uVar1 != 0) {
    value = (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
            super_JavascriptLibraryBase).undefinedValue.ptr;
    index_00 = 0;
    do {
      DynamicTypeHandler::SetSlotUnchecked(instance,index_00,value);
      index_00 = index_00 + 1;
    } while (uVar1 != index_00);
  }
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::SetAllPropertiesToUndefined(DynamicObject* instance, bool invalidateFixedFields)
    {
        // Note: This method is currently only called from ResetObject, which in turn only applies to external objects.
        // Before using for other purposes, make sure the assumptions made here make sense in the new context.  In particular,
        // the invalidateFixedFields == false is only correct if a) the object is known not to have any, or b) the type of the
        // object has changed and/or property guards have already been invalidated through some other means.

        if (IsNotExtensibleSupported)
        {
            // The Var for window is reused across navigation. we shouldn't preserve the IsExtensibleFlag when we don't keep
            // the expandos. Reset the IsExtensibleFlag in cleanup scenario should be good enough
            // to cover all the preventExtension/Freeze/Seal scenarios.
            ChangeFlags(IsExtensibleFlag | IsSealedOnceFlag | IsFrozenOnceFlag, IsExtensibleFlag);
        }

#if ENABLE_FIXED_FIELDS
        int propertyCount = this->propertyMap->Count();
        if (invalidateFixedFields)
        {
            Js::ScriptContext* scriptContext = instance->GetScriptContext();
            for (int propertyIndex = 0; propertyIndex < propertyCount; propertyIndex++)
            {
                const TMapKey propertyRecord = this->propertyMap->GetKeyAt(propertyIndex);
                SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor = this->propertyMap->GetReferenceAt(propertyIndex);
                InvalidateFixedField(propertyRecord, descriptor, scriptContext);
            }
        }
#endif

        Js::RecyclableObject* undefined = instance->GetLibrary()->GetUndefined();
        int slotCount = this->nextPropertyIndex;
        for (int slotIndex = 0; slotIndex < slotCount; slotIndex++)
        {
            SetSlotUnchecked(instance, slotIndex, undefined);
        }
    }